

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

Tree * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::treeFromString
          (Tree *__return_storage_ptr__,Interpreter *this,string *s)

{
  yml *this_00;
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  error_flags eVar4;
  Tree *pTVar5;
  undefined8 in_RCX;
  csubstr yaml;
  
  this_00 = *(yml **)&this->heap;
  pcVar1 = (char *)(this->heap).gcTuneGrowthTrigger;
  yaml.len._1_7_ = (undefined7)((ulong)in_RCX >> 8);
  yaml.len._0_1_ = pcVar1 == (char *)0x0 || this_00 != (yml *)0x0;
  if (pcVar1 == (char *)0x0 || this_00 != (yml *)0x0) {
    yaml.str = pcVar1;
    c4::yml::parse_in_arena(__return_storage_ptr__,this_00,yaml);
    return __return_storage_ptr__;
  }
  eVar4 = c4::get_error_flags();
  if ((eVar4 & 1) != 0) {
    bVar3 = c4::is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      pTVar5 = (Tree *)(*pcVar2)();
      return pTVar5;
    }
  }
  c4::handle_error(0x1e71c6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x147e,"str || !len_");
}

Assistant:

const ryml::Tree treeFromString(const std::string& s) {
        return ryml::parse_in_arena(ryml::to_csubstr(s));
    }